

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hh
# Opt level: O3

void __thiscall Enumerator::Enumerator(Enumerator *this,string *nm)

{
  (this->enumconstant)._M_dataplus._M_p = (pointer)&(this->enumconstant).field_2;
  (this->enumconstant)._M_string_length = 0;
  (this->enumconstant).field_2._M_local_buf[0] = '\0';
  this->constantassigned = false;
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

Enumerator(const string &nm) { constantassigned = false; enumconstant = nm; }